

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

double __thiscall IF97::BaseRegion::dgammar_dPI(BaseRegion *this,double T,double p)

{
  double dVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  double x;
  double x_00;
  double dVar4;
  double dVar5;
  double dVar6;
  
  (*this->_vptr_BaseRegion[3])(p);
  (*this->_vptr_BaseRegion[4])(T,this);
  dVar6 = 0.0;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 1) {
    iVar2 = (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar3];
    dVar1 = (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3];
    dVar4 = powi(x,iVar2 + -1);
    dVar5 = powi(x_00,(this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar3]);
    dVar6 = dVar6 + dVar5 * dVar4 * (double)iVar2 * dVar1;
  }
  return dVar6;
}

Assistant:

double dgammar_dPI(double T, double p) const{
            const double _PI = PIrterm(p), _TAU = TAUrterm(T);
            double summer = 0;
            for (std::size_t i = 0; i < Jr.size(); ++i){
                summer += nr[i]*Ir[i]*powi(_PI, Ir[i]-1)*powi(_TAU, Jr[i]);
            }
            return summer;
        }